

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

uint32_t __thiscall
duckdb::ParquetReader::ReadData
          (ParquetReader *this,TProtocol *iprot,data_ptr_t buffer,uint32_t buffer_size)

{
  uint32_t uVar1;
  ParquetEncryptionConfig *this_00;
  string *key;
  type encryption_util_p;
  __shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  if ((this->parquet_options).encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    this_00 = shared_ptr<duckdb::ParquetEncryptionConfig,_true>::operator->
                        (&(this->parquet_options).encryption_config);
    key = ParquetEncryptionConfig::GetFooterKey_abi_cxx11_(this_00);
    encryption_util_p = shared_ptr<duckdb::EncryptionUtil,_true>::operator*(&this->encryption_util);
    uVar1 = ParquetCrypto::ReadData(iprot,buffer,buffer_size,key,encryption_util_p);
    return uVar1;
  }
  ::std::__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_38,
               &(iprot->ptrans_).
                super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
              );
  uVar1 = (*(local_38._M_ptr)->_vptr_TTransport[6])(local_38._M_ptr,buffer,(ulong)buffer_size);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return uVar1;
}

Assistant:

uint32_t ParquetReader::ReadData(duckdb_apache::thrift::protocol::TProtocol &iprot, const data_ptr_t buffer,
                                 const uint32_t buffer_size) {
	if (parquet_options.encryption_config) {
		return ParquetCrypto::ReadData(iprot, buffer, buffer_size, parquet_options.encryption_config->GetFooterKey(),
		                               *encryption_util);
	} else {
		return iprot.getTransport()->read(buffer, buffer_size);
	}
}